

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredDeleteTest_Test::
~ComparisonTest_IgnoredDeleteTest_Test(ComparisonTest_IgnoredDeleteTest_Test *this)

{
  ComparisonTest_IgnoredDeleteTest_Test *this_local;
  
  ComparisonTest::~ComparisonTest(&this->super_ComparisonTest);
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredDeleteTest) {
  proto1diff_.set_v(3);
  proto2diff_.set_w("foo");

  ignore_field("v");

  EXPECT_EQ(
      "ignored: v\n"
      "added: w: \"foo\"\n",
      RunDiff());
}